

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

ColorEncoding pbrt::ColorEncoding::Get(string *name,Allocator alloc)

{
  string_view str;
  bool bVar1;
  int iVar2;
  LogLevel extraout_var;
  size_type sVar3;
  char *__nptr;
  iterator this;
  iterator __k;
  mapped_type *this_00;
  size_t in_RDX;
  string *in_RSI;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding> in_RDI
  ;
  double dVar4;
  iterator iter;
  lock_guard<std::mutex> lock;
  Float gamma;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  ColorEncoding *enc;
  GammaColorEncoding *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  float *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  iterator args;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  LogLevel level;
  pointer in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI.bits;
  bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  if (bVar1) {
    ColorEncoding((ColorEncoding *)in_stack_ffffffffffffff60,
                  (ColorEncoding *)in_stack_ffffffffffffff58);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    if (!bVar1) {
      if ((Get(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)::cache ==
           '\0') &&
         (iVar2 = __cxa_guard_acquire(&Get(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
                                       ::cache), iVar2 != 0)) {
        std::
        map<float,_pbrt::ColorEncoding,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncoding>_>_>
        ::map((map<float,_pbrt::ColorEncoding,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncoding>_>_>
               *)0x98e662);
        __cxa_atexit(std::
                     map<float,_pbrt::ColorEncoding,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncoding>_>_>
                     ::~map,&Get::cache,&__dso_handle);
        __cxa_guard_release(&Get(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
                             ::cache);
      }
      std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
      str._M_str = (char *)pbVar5;
      str._M_len = in_RDX;
      level = extraout_var;
      SplitStringsFromWhitespace_abi_cxx11_(str);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffd0);
      if (sVar3 == 2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffd0,0);
        bVar1 = std::operator!=(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffffd0,1);
          __nptr = (char *)std::__cxx11::string::c_str();
          dVar4 = atof(__nptr);
          if (((float)dVar4 == 0.0) && (!NAN((float)dVar4))) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&stack0xffffffffffffffd0,1);
            ErrorExit<std::__cxx11::string&>
                      ((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_RDI.bits);
          }
          std::lock_guard<std::mutex>::lock_guard
                    ((lock_guard<std::mutex> *)in_stack_ffffffffffffff60,
                     (mutex_type *)in_stack_ffffffffffffff58);
          this = std::
                 map<float,_pbrt::ColorEncoding,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncoding>_>_>
                 ::find((map<float,_pbrt::ColorEncoding,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncoding>_>_>
                         *)in_stack_ffffffffffffff58,(key_type_conflict2 *)0x98e79c);
          args = this;
          __k = std::
                map<float,_pbrt::ColorEncoding,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncoding>_>_>
                ::end((map<float,_pbrt::ColorEncoding,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncoding>_>_>
                       *)in_stack_ffffffffffffff58);
          bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffa0,
                                  (_Self *)&stack0xffffffffffffff98);
          if (bVar1) {
            std::_Rb_tree_iterator<std::pair<const_float,_pbrt::ColorEncoding>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_float,_pbrt::ColorEncoding>_> *)0x98e7dd);
            ColorEncoding((ColorEncoding *)in_stack_ffffffffffffff60,
                          (ColorEncoding *)in_stack_ffffffffffffff58);
          }
          else {
            pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::GammaColorEncoding,float&>
                      ((polymorphic_allocator<std::byte> *)this._M_node,in_stack_ffffffffffffff68);
            TaggedPointer<pbrt::GammaColorEncoding>
                      ((ColorEncoding *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            this_00 = std::
                      map<float,_pbrt::ColorEncoding,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncoding>_>_>
                      ::operator[]((map<float,_pbrt::ColorEncoding,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncoding>_>_>
                                    *)args._M_node,(key_type_conflict2 *)__k._M_node);
            operator=(this_00,(ColorEncoding *)in_stack_ffffffffffffff58);
            if (logging::logLevel < 1) {
              Log<std::__cxx11::string_const&,float&,pbrt::ColorEncoding&>
                        (level,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                         in_stack_ffffffffffffffa8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         args._M_node,(float *)__k._M_node,
                         (ColorEncoding *)in_stack_ffffffffffffffd0);
            }
          }
          std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x98e8c2);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this._M_node);
          return (ColorEncoding)
                 (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                  )in_RDI.bits;
        }
      }
      ErrorExit<std::__cxx11::string_const&>
                ((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI.bits);
    }
    ColorEncoding((ColorEncoding *)in_stack_ffffffffffffff60,
                  (ColorEncoding *)in_stack_ffffffffffffff58);
  }
  return (ColorEncoding)
         (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )in_RDI.bits;
}

Assistant:

const ColorEncoding ColorEncoding::Get(const std::string &name, Allocator alloc) {
    if (name == "linear")
        return Linear;
    else if (name == "sRGB")
        return sRGB;
    else {
        static std::map<float, ColorEncoding> cache;
        static std::mutex mutex;

        std::vector<std::string> params = SplitStringsFromWhitespace(name);
        if (params.size() != 2 || params[0] != "gamma")
            ErrorExit("%s: expected \"gamma <value>\" for color encoding", name);
        Float gamma = atof(params[1].c_str());
        if (gamma == 0)
            ErrorExit("%s: unable to parse gamma value", params[1]);

        std::lock_guard<std::mutex> lock(mutex);
        auto iter = cache.find(gamma);
        if (iter != cache.end())
            return iter->second;

        ColorEncoding enc = alloc.new_object<GammaColorEncoding>(gamma);
        cache[gamma] = enc;
        LOG_VERBOSE("Added ColorEncoding %s for gamma %f -> %s", name, gamma, enc);
        return enc;
    }
}